

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vector.h
# Opt level: O2

Vector * clip(Vector *v)

{
  Vector *in_RDI;
  double dVar1;
  undefined1 auVar2 [16];
  
  auVar2._0_8_ = v->x;
  auVar2._8_8_ = v->y;
  auVar2 = minpd(_DAT_0010a0b0,auVar2);
  auVar2 = maxpd(auVar2,ZEXT816(0));
  v->x = (double)auVar2._0_8_;
  v->y = (double)auVar2._8_8_;
  dVar1 = 1.0;
  if (v->z <= 1.0) {
    dVar1 = v->z;
  }
  if (dVar1 <= 0.0) {
    dVar1 = 0.0;
  }
  v->z = dVar1;
  in_RDI->x = (double)auVar2._0_8_;
  in_RDI->y = (double)auVar2._8_8_;
  in_RDI->z = dVar1;
  return in_RDI;
}

Assistant:

inline Vector clip(Vector v)
{
    // when libc++ catches up with c++17:
    // v.x = std::clamp(v.x, 0.0, 1.0);
    // v.y = std::clamp(v.y, 0.0, 1.0);
    // v.z = std::clamp(v.z, 0.0, 1.0);

    v.x = std::max(0.0, std::min(v.x, 1.0));
    v.y = std::max(0.0, std::min(v.y, 1.0));
    v.z = std::max(0.0, std::min(v.z, 1.0));
    return v;
}